

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O2

void ndn_unix_face_accept(void *self,size_t param_len,void *param)

{
  int __fd;
  int iVar1;
  ndn_face_intf_t *face;
  ndn_msg *pnVar2;
  int *piVar3;
  
  *(undefined8 *)((long)self + 0x98) = 0;
  __fd = accept(*(int *)((long)self + 0xa0),(sockaddr *)0x0,(socklen_t *)0x0);
  if (-1 < __fd) {
    face = (ndn_face_intf_t *)malloc(0x10b0);
    if (face != (ndn_face_intf_t *)0x0) {
      face->face_id = 0xffff;
      iVar1 = ndn_forwarder_register_face(face);
      if (iVar1 == 0) {
        face->state = '\x01';
        face->type = '\x01';
        face->up = (ndn_face_intf_up)0x0;
        face->down = ndn_unix_slave_face_down;
        face->send = ndn_unix_face_send;
        face->destroy = (ndn_face_intf_destroy)0x0;
        *(undefined1 *)&face[0x6a].destroy = 0;
        *(int *)&face[4].up = __fd;
        *(undefined4 *)((long)&face[0x6a].down + 4) = 0;
        pnVar2 = ndn_msgqueue_post(face,ndn_unix_face_recv,0,(void *)0x0);
        *(ndn_msg **)&face[3].face_id = pnVar2;
        if (pnVar2 != (ndn_msg *)0x0) goto LAB_00112352;
        (*face->down)(face);
      }
      else {
        free(face);
      }
    }
    close(__fd);
LAB_00112352:
    pnVar2 = ndn_msgqueue_post(self,ndn_unix_face_accept,param_len,param);
    *(ndn_msg **)((long)self + 0x98) = pnVar2;
    return;
  }
  if (__fd == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == 0xb) goto LAB_00112352;
  }
  (**(code **)((long)self + 0x10))();
  return;
}

Assistant:

static void
ndn_unix_face_accept(void *self, size_t param_len, void *param){
  ndn_unix_face_t* ptr = (ndn_unix_face_t*)self;
  int ret = 0;

  ptr->process_event = NULL;

  ret = accept(ptr->sock, NULL, NULL);
  if(ret >= 0){
    //printf("New face created %d\n", ret);
    if(ndn_unix_slave_face_construct(ret) == NULL){
      close(ret);
    }
  }else if(ret == -1 && errno == EWOULDBLOCK){
    //No more connections
  }else{
    ndn_face_down(&ptr->intf);
    return;
  }

  ptr->process_event = ndn_msgqueue_post(self, ndn_unix_face_accept, param_len, param);
}